

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int __thiscall doctest::Context::run(Context *this)

{
  String *this_00;
  int *piVar1;
  uint *puVar2;
  pointer *pppIVar3;
  uint uVar4;
  uint uVar5;
  pointer pvVar6;
  iterator __position;
  const_iterator __position_00;
  pointer ppIVar7;
  TestCase *pTVar8;
  anon_unknown_14 *paVar9;
  TestRunStats *pTVar10;
  ContextState *pCVar11;
  iterator __last;
  bool bVar12;
  char cVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int result;
  int iVar21;
  undefined1 *puVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var25;
  size_t sVar26;
  const_iterator cVar27;
  long lVar28;
  ContextState *pCVar29;
  uint uVar30;
  code *__comp;
  IReporter **curr;
  TestCase *this_01;
  pointer ppIVar31;
  _Base_ptr this_02;
  _Ios_Openmode _Var32;
  IReporter **curr_rep;
  ulong uVar33;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_398;
  iterator iStack_390;
  TestCase **local_388;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> local_378;
  TestCase *local_358;
  TestCase **local_350;
  ContextState *local_348;
  TestCase **local_340;
  anon_union_24_2_13149d16_for_String_2 local_338 [5];
  int local_2b0;
  anon_unknown_14 *local_298;
  ContextState *local_290;
  sigaltstack local_288;
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  local_270;
  char local_240 [16];
  ostream local_230;
  
  pCVar11 = detail::g_cs;
  pCVar29 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar29;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar29->super_ContextOptions).no_colors;
  (pCVar29->super_TestRunStats).numAsserts = 0;
  (pCVar29->super_TestRunStats).numAssertsFailed = 0;
  (pCVar29->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar29->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar29->super_TestRunStats).numTestCases = 0;
  (pCVar29->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar29->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar29->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(local_240);
  pCVar29 = this->p;
  if ((pCVar29->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar29->super_ContextOptions).quiet == true) {
      puVar22 = discardOut;
    }
    else {
      bVar14 = (pCVar29->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar14 < '\0') {
        uVar30 = (pCVar29->super_ContextOptions).out.field_0.data.size;
      }
      else {
        uVar30 = 0x17 - (bVar14 & 0x1f);
      }
      if (uVar30 == 0) {
        puVar22 = (undefined1 *)&std::cout;
      }
      else {
        if ((char)bVar14 < '\0') {
          _Var32 = (_Ios_Openmode)*(undefined8 *)&(pCVar29->super_ContextOptions).out.field_0;
        }
        else {
          _Var32 = (int)pCVar29 + (_S_trunc|_S_in);
        }
        std::fstream::open(local_240,_Var32);
        puVar22 = (undefined1 *)&local_230;
        pCVar29 = this->p;
      }
    }
    (pCVar29->super_ContextOptions).cout = (ostream *)puVar22;
  }
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar6 = (pCVar29->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar23 = String::allocate((String *)local_338,7);
    builtin_strncpy(pcVar23,"console",7);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              (pvVar6 + 8,(String *)local_338);
    if (((long)local_338[0]._16_8_ < 0) && ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
      operator_delete__((void *)local_338[0]._0_8_);
    }
  }
  local_348 = pCVar11;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var24 = anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      if (*(char *)((long)&p_Var24[1]._M_right + 7) < '\0') {
        this_02 = p_Var24[1]._M_parent;
      }
      else {
        this_02 = (_Base_ptr)&p_Var24[1]._M_parent;
      }
      pCVar29 = this->p;
      pvVar6 = (pCVar29->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar12 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)this_02,
                          *(char **)&pvVar6[8].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[8].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,
                          (pCVar29->super_ContextOptions).case_sensitive);
      if (bVar12) {
        local_338[0]._0_8_ = (**(code **)(p_Var24 + 2))(detail::g_cs);
        __position._M_current =
             (pCVar29->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar29->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
          _M_realloc_insert<doctest::IReporter*>
                    ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                     &pCVar29->reporters_currently_used,__position,(IReporter **)local_338);
        }
        else {
          *__position._M_current = (IReporter *)local_338[0]._0_8_;
          pppIVar3 = &(pCVar29->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar3 = *pppIVar3 + 1;
        }
      }
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while ((_Rb_tree_header *)p_Var24 !=
             &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header);
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var24 = anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar29 = this->p;
      __position_00._M_current =
           (pCVar29->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338[0]._0_8_ = (**(code **)(p_Var24 + 2))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar29->reporters_currently_used,__position_00,(value_type *)local_338);
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while ((_Rb_tree_header *)p_Var24 !=
             &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header);
  }
  pCVar29 = this->p;
  if (((((pCVar29->super_ContextOptions).no_run != false) ||
       ((pCVar29->super_ContextOptions).version != false)) ||
      ((pCVar29->super_ContextOptions).help != false)) ||
     ((pCVar29->super_ContextOptions).list_reporters == true)) {
    ppIVar31 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar31 != ppIVar7) {
      do {
        local_338[0].data.ptr = (TestCase *)0x0;
        local_338[0]._8_8_ = (void *)0x0;
        local_338[0]._16_8_ = 0;
        (**(*ppIVar31)->_vptr_IReporter)(*ppIVar31,local_338);
        ppIVar31 = ppIVar31 + 1;
      } while (ppIVar31 != ppIVar7);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar13 = std::__basic_file<char>::is_open();
    pCVar29 = local_348;
    if (cVar13 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = pCVar29;
    is_running_in_test = 0;
    pCVar29 = this->p;
    ppIVar31 = (pCVar29->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar7 = (pCVar29->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar31 != ppIVar7) {
      do {
        if (*ppIVar31 != (IReporter *)0x0) {
          (*(*ppIVar31)->_vptr_IReporter[0xd])();
        }
        ppIVar31 = ppIVar31 + 1;
      } while (ppIVar31 != ppIVar7);
      pCVar29 = this->p;
      ppIVar31 = (pCVar29->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar29->reporters_currently_used).
          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppIVar31) {
        (pCVar29->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppIVar31;
      }
    }
    if (((pCVar29->super_TestRunStats).numTestCasesFailed == 0) ||
       (iVar21 = 1, (pCVar29->super_ContextOptions).no_exitcode == true)) {
      iVar21 = 0;
    }
    goto LAB_0010cc49;
  }
  local_398._M_current = (TestCase **)0x0;
  iStack_390._M_current = (TestCase **)0x0;
  local_388 = (TestCase **)0x0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var24 = detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_338[0]._0_8_ = p_Var24 + 1;
      if (iStack_390._M_current == local_388) {
        std::
        vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
        _M_realloc_insert<doctest::detail::TestCase_const*>
                  ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                    *)&local_398,iStack_390,(TestCase **)local_338);
      }
      else {
        *iStack_390._M_current = (TestCase *)local_338[0]._0_8_;
        iStack_390._M_current = iStack_390._M_current + 1;
      }
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while ((_Rb_tree_header *)p_Var24 !=
             &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = iStack_390._M_current;
  _Var25._M_current = local_398._M_current;
  pCVar29 = this->p;
  (pCVar29->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)iStack_390._M_current - (long)local_398._M_current) >> 3);
  if (iStack_390._M_current != local_398._M_current) {
    this_00 = &(pCVar29->super_ContextOptions).order_by;
    iVar21 = String::compare(this_00,"file",true);
    if (iVar21 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar21 = String::compare(this_00,"suite",true);
      if (iVar21 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar21 = String::compare(this_00,"name",true);
        if (iVar21 != 0) {
          iVar21 = String::compare(this_00,"rand",true);
          if (iVar21 == 0) {
            srand((pCVar29->super_ContextOptions).rand_seed);
            _Var25._M_current = local_398._M_current;
            for (uVar33 = (long)iStack_390._M_current - (long)local_398._M_current >> 3; uVar33 != 1
                ; uVar33 = uVar33 - 1) {
              iVar21 = rand();
              pTVar8 = _Var25._M_current[uVar33 - 1];
              iVar21 = (int)((ulong)(long)iVar21 % uVar33);
              _Var25._M_current[uVar33 - 1] = _Var25._M_current[iVar21];
              _Var25._M_current[iVar21] = pTVar8;
            }
          }
          goto LAB_0010cdd6;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var25,(__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                       )__last._M_current,__comp);
  }
LAB_0010cdd6:
  local_270._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_270._M_impl.super__Rb_tree_header._M_header;
  local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar29 = this->p;
  local_270._M_impl.super__Rb_tree_header._M_header._M_right =
       local_270._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((pCVar29->super_ContextOptions).count == false) &&
     ((pCVar29->super_ContextOptions).list_test_cases != true)) {
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (TestCaseData **)0x0;
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (TestCaseData **)0x0;
    bVar12 = true;
    if ((pCVar29->super_ContextOptions).list_test_suites == false) {
      ppIVar7 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar31 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar31 != ppIVar7;
          ppIVar31 = ppIVar31 + 1) {
        (*(*ppIVar31)->_vptr_IReporter[1])();
      }
      bVar12 = false;
    }
  }
  else {
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (TestCaseData **)0x0;
    local_378.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (TestCaseData **)0x0;
    bVar12 = true;
  }
  local_350 = iStack_390._M_current;
  _Var25._M_current = local_398._M_current;
  if (local_398._M_current != iStack_390._M_current) {
    do {
      pTVar8 = *_Var25._M_current;
      local_290 = this->p;
      if ((pTVar8->super_TestCaseData).m_skip == true) {
        bVar14 = (local_290->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar14 = 0;
      }
      this_01 = pTVar8;
      if ((pTVar8->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
        this_01 = (TestCase *)(pTVar8->super_TestCaseData).m_file.field_0.data.ptr;
      }
      pvVar6 = (local_290->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar20 = (local_290->super_ContextOptions).case_sensitive;
      local_340 = _Var25._M_current;
      bVar15 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)this_01,
                          *(char **)&(pvVar6->
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     )._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          (pvVar6->
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar20);
      bVar16 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)this_01,
                          *(char **)&pvVar6[1].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[1].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar20);
      paVar9 = (anon_unknown_14 *)(pTVar8->super_TestCaseData).m_test_suite;
      bVar17 = anon_unknown_14::matchesAny
                         (paVar9,*(char **)&pvVar6[2].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[2].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar20);
      local_298 = paVar9;
      bVar18 = anon_unknown_14::matchesAny
                         (paVar9,*(char **)&pvVar6[3].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[3].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar20);
      paVar9 = (anon_unknown_14 *)(pTVar8->super_TestCaseData).m_name;
      local_358 = pTVar8;
      bVar19 = anon_unknown_14::matchesAny
                         (paVar9,*(char **)&pvVar6[4].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[4].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar20);
      bVar20 = anon_unknown_14::matchesAny
                         (paVar9,*(char **)&pvVar6[5].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar6[5].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar20);
      paVar9 = local_298;
      pTVar8 = local_358;
      uVar30 = (local_290->super_TestRunStats).numTestCasesPassingFilters;
      if ((!bVar20 && (bVar14 & 1) == 0) && ((bVar19 && (!bVar18 && !bVar16)) && (bVar17 && bVar15))
         ) {
        uVar30 = uVar30 + 1;
        (local_290->super_TestRunStats).numTestCasesPassingFilters = uVar30;
      }
      uVar4 = (local_290->super_ContextOptions).first;
      uVar5 = (local_290->super_ContextOptions).last;
      if ((uVar4 <= uVar30 && (uVar5 < uVar4 || uVar30 <= uVar5)) &&
          ((!bVar20 && (bVar14 & 1) == 0) &&
          ((bVar19 && (!bVar18 && !bVar16)) && (bVar17 && bVar15)))) {
        if ((local_290->super_ContextOptions).count == false) {
          if ((local_290->super_ContextOptions).list_test_cases == true) {
            local_338[0].data.ptr = local_358;
            if (local_378.
                super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_378.
                super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::_M_realloc_insert<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)&local_378,
                         (iterator)
                         local_378.
                         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(TestCaseData **)local_338);
            }
            else {
              *local_378.
               super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = &local_358->super_TestCaseData;
              local_378.
              super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_378.
                   super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else if ((local_290->super_ContextOptions).list_test_suites == true) {
            sVar26 = strlen((char *)local_298);
            pcVar23 = String::allocate((String *)local_338,(uint)sVar26);
            memcpy(pcVar23,paVar9,sVar26 & 0xffffffff);
            cVar27 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find(&local_270,(key_type *)local_338);
            if ((_Rb_tree_header *)cVar27._M_node == &local_270._M_impl.super__Rb_tree_header) {
              cVar13 = *(pTVar8->super_TestCaseData).m_test_suite;
              if (((long)local_338[0]._16_8_ < 0) &&
                 ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                operator_delete__((void *)local_338[0]._0_8_);
              }
              if (cVar13 != '\0') {
                local_338[0].data.ptr = pTVar8;
                std::
                vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ::push_back(&local_378,(value_type *)local_338);
                String::String((String *)local_338,(pTVar8->super_TestCaseData).m_test_suite);
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>(&local_270,(String *)local_338);
                if (((long)local_338[0]._16_8_ < 0) &&
                   ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                  operator_delete__((void *)local_338[0]._0_8_);
                }
                puVar2 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
                *puVar2 = *puVar2 + 1;
              }
            }
            else if (((long)local_338[0]._16_8_ < 0) &&
                    ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
              operator_delete__((void *)local_338[0]._0_8_);
            }
          }
          else {
            (local_290->super_ContextOptions).currentTest = local_358;
            (local_290->super_CurrentTestCaseStats).failure_flags = 0;
            (local_290->super_CurrentTestCaseStats).seconds = 0.0;
            lVar28 = 0;
            do {
              LOCK();
              pcVar23 = (local_290->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                        lVar28 + -4;
              pcVar23[0] = '\0';
              pcVar23[1] = '\0';
              pcVar23[2] = '\0';
              pcVar23[3] = '\0';
              UNLOCK();
              lVar28 = lVar28 + 0x40;
            } while (lVar28 != 0x800);
            pCVar29 = this->p;
            lVar28 = 0;
            do {
              LOCK();
              pcVar23 = (pCVar29->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar28 + -4;
              pcVar23[0] = '\0';
              pcVar23[1] = '\0';
              pcVar23[2] = '\0';
              pcVar23[3] = '\0';
              UNLOCK();
              lVar28 = lVar28 + 0x40;
            } while (lVar28 != 0x800);
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar7 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar31 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar31 != ppIVar7;
                ppIVar31 = ppIVar31 + 1) {
              (*(*ppIVar31)->_vptr_IReporter[3])();
            }
            pCVar29 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar29->timer).m_ticks =
                 (ticks_t)(local_338[0].data.ptr * 1000000 + local_338[0]._8_8_);
            pCVar29 = this->p;
            bVar20 = true;
            do {
              pCVar29->should_reenter = false;
              pCVar29->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar29->subcasesStack,
                              (pCVar29->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (anonymous_namespace)::FatalConditionHandler::altStackSize;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((void *)((long)local_338 + 8),0,0x90);
              local_338[0].data.ptr = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar22 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar28 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar28),
                          (sigaction *)local_338,(sigaction *)puVar22);
                lVar28 = lVar28 + 0x10;
                puVar22 = (undefined1 *)((long)puVar22 + 0x98);
              } while (lVar28 != 0x60);
              (*pTVar8->m_test)();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              pCVar29 = this->p;
              if (0 < (pCVar29->super_ContextOptions).abort_after) {
                pTVar10 = &pCVar29->super_TestRunStats;
                iVar21 = 0;
                lVar28 = 0;
                do {
                  iVar21 = iVar21 + *(int *)((pCVar29->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar28 + -4);
                  lVar28 = lVar28 + 0x40;
                } while (lVar28 != 0x800);
                pCVar29 = this->p;
                if ((pCVar29->super_ContextOptions).abort_after <=
                    iVar21 + pTVar10->numAssertsFailed) {
                  piVar1 = &(pCVar29->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar20 = false;
                }
              }
              if (pCVar29->should_reenter != true) break;
              if (bVar20) {
                ppIVar31 = (detail::g_cs->reporters_currently_used).
                           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppIVar7 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (ppIVar31 != ppIVar7) {
                  do {
                    (*(*ppIVar31)->_vptr_IReporter[4])(*ppIVar31,pTVar8);
                    ppIVar31 = ppIVar31 + 1;
                  } while (ppIVar31 != ppIVar7);
                  pCVar29 = this->p;
                  if ((pCVar29->should_reenter & 1U) == 0) break;
                }
              }
            } while (bVar20);
            detail::ContextState::finalizeTestCaseData(pCVar29);
            ppIVar7 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar31 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar31 != ppIVar7;
                ppIVar31 = ppIVar31 + 1) {
              (*(*ppIVar31)->_vptr_IReporter[5])
                        (*ppIVar31,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar29 = this->p;
            (pCVar29->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar21 = (pCVar29->super_ContextOptions).abort_after;
            if ((0 < iVar21) && (iVar21 <= (pCVar29->super_TestRunStats).numAssertsFailed)) break;
          }
        }
      }
      else if (!bVar12) {
        ppIVar7 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar31 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar31 != ppIVar7;
            ppIVar31 = ppIVar31 + 1) {
          (*(*ppIVar31)->_vptr_IReporter[0xb])(*ppIVar31,pTVar8);
        }
      }
      _Var25._M_current = local_340 + 1;
    } while (local_340 + 1 != local_350);
  }
  if (bVar12) {
    local_338[0]._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338[0]._0_8_ = (TestCase *)0x0;
    }
    local_338[0]._8_8_ =
         local_378.
         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_338[0]._16_4_ =
         (int)((ulong)((long)local_378.
                             super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_378.
                            super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ppIVar31 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar31 != ppIVar7) {
      do {
        (**(*ppIVar31)->_vptr_IReporter)(*ppIVar31,local_338);
        ppIVar31 = ppIVar31 + 1;
      } while (ppIVar31 != ppIVar7);
    }
  }
  else {
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar31 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar31 != ppIVar7;
        ppIVar31 = ppIVar31 + 1) {
      (*(*ppIVar31)->_vptr_IReporter[2])(*ppIVar31,&detail::g_cs->super_TestRunStats);
    }
  }
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar13 = std::__basic_file<char>::is_open();
  pCVar29 = local_348;
  if (cVar13 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = pCVar29;
  is_running_in_test = 0;
  pCVar29 = this->p;
  ppIVar31 = (pCVar29->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppIVar7 = (pCVar29->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar31 != ppIVar7) {
    do {
      if (*ppIVar31 != (IReporter *)0x0) {
        (*(*ppIVar31)->_vptr_IReporter[0xd])();
      }
      ppIVar31 = ppIVar31 + 1;
    } while (ppIVar31 != ppIVar7);
    pCVar29 = this->p;
    ppIVar31 = (pCVar29->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar29->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar31) {
      (pCVar29->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar31;
    }
  }
  if (((pCVar29->super_TestRunStats).numTestCasesFailed == 0) ||
     (iVar21 = 1, (pCVar29->super_ContextOptions).no_exitcode == true)) {
    iVar21 = 0;
  }
  if (local_378.
      super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.
                    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&local_270);
  if (local_398._M_current != (TestCase **)0x0) {
    operator_delete(local_398._M_current,(long)local_388 - (long)local_398._M_current);
  }
LAB_0010cc49:
  std::fstream::~fstream(local_240);
  return iVar21;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    return cleanup_and_return();
}